

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O0

void duckdb::ListGenericFold<float,duckdb::InnerProductOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  anon_class_24_3_3d016869 fun;
  bool bVar1;
  undefined8 uVar2;
  float *pfVar3;
  DataChunk *in_RDI;
  float *rhs_data;
  float *lhs_data;
  Vector *rhs_child;
  Vector *lhs_child;
  idx_t rhs_count;
  idx_t lhs_count;
  value_type *rhs_vec;
  value_type *lhs_vec;
  idx_t count;
  string *func_name;
  BoundFunctionExpression *expr;
  ExecuteFunctionState *lstate;
  idx_t in_stack_00000238;
  Vector *in_stack_00000240;
  Vector *in_stack_fffffffffffffe88;
  ExpressionState *in_stack_fffffffffffffe90;
  DataChunk *in_stack_fffffffffffffea8;
  allocator *paVar4;
  idx_t in_stack_fffffffffffffeb8;
  VectorType vector_type_p;
  Vector *this;
  BaseExpression *in_stack_fffffffffffffed0;
  float *local_128;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffef0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffef8;
  InvalidInputException *in_stack_ffffffffffffff00;
  allocator local_e9;
  string local_e8 [39];
  undefined1 local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  Vector *local_68;
  Vector *local_60;
  idx_t local_58;
  idx_t local_50;
  reference local_48;
  reference local_40;
  idx_t local_38;
  Vector *local_30;
  BoundFunctionExpression *local_28;
  ExecuteFunctionState *local_20;
  DataChunk *local_8;
  
  local_8 = in_RDI;
  local_20 = ExpressionState::Cast<duckdb::ExecuteFunctionState>(in_stack_fffffffffffffe90);
  local_28 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(in_stack_fffffffffffffed0);
  local_30 = (Vector *)
             &(local_28->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name
  ;
  local_38 = DataChunk::size(local_8);
  local_40 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe90,
                        (size_type)in_stack_fffffffffffffe88);
  local_48 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe90,
                        (size_type)in_stack_fffffffffffffe88);
  local_50 = ListVector::GetListSize(in_stack_fffffffffffffe88);
  local_58 = ListVector::GetListSize(in_stack_fffffffffffffe88);
  local_60 = ListVector::GetEntry((Vector *)0x2044a24);
  local_68 = ListVector::GetEntry((Vector *)0x2044a39);
  Vector::Flatten(in_stack_00000240,in_stack_00000238);
  Vector::Flatten(in_stack_00000240,in_stack_00000238);
  FlatVector::Validity((Vector *)0x2044a78);
  bVar1 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                    ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffe90,
                     (idx_t)in_stack_fffffffffffffe88);
  if (!bVar1) {
    local_c1 = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    paVar4 = &local_89;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_88,"%s: left argument can not contain NULL values",paVar4);
    ::std::__cxx11::string::string(local_c0,(string *)local_30);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (in_stack_ffffffffffffff00,(string *)in_stack_fffffffffffffef8._M_pi,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffef0._M_pi);
    local_c1 = 0;
    __cxa_throw(uVar2,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
               );
  }
  FlatVector::Validity((Vector *)0x2044bbb);
  bVar1 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                    ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffe90,
                     (idx_t)in_stack_fffffffffffffe88);
  if (bVar1) {
    pfVar3 = FlatVector::GetData<float>((Vector *)0x2044cec);
    local_128 = FlatVector::GetData<float>((Vector *)0x2044cfe);
    fun.lhs_data._0_1_ = (LogicalTypeId)in_stack_fffffffffffffee8;
    fun.lhs_data._1_1_ = SUB71(in_stack_fffffffffffffee8,1);
    fun.lhs_data._2_5_ = SUB75(in_stack_fffffffffffffee8,2);
    fun.func_name = (string *)pfVar3;
    fun.lhs_data._7_1_ = in_stack_fffffffffffffeef;
    fun.rhs_data = (float **)in_stack_fffffffffffffef0._M_pi;
    this = local_30;
    BinaryExecutor::
    ExecuteWithNulls<duckdb::list_entry_t,duckdb::list_entry_t,float,duckdb::ListGenericFold<float,duckdb::InnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_>
              ((Vector *)&local_128,(Vector *)&stack0xfffffffffffffee0,local_30,
               in_stack_fffffffffffffeb8,fun);
    vector_type_p = (VectorType)(in_stack_fffffffffffffeb8 >> 0x38);
    bVar1 = DataChunk::AllConstant(in_stack_fffffffffffffea8);
    if (bVar1) {
      Vector::SetVectorType(this,vector_type_p);
    }
    return;
  }
  uVar2 = __cxa_allocate_exception(0x10);
  paVar4 = &local_e9;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_e8,"%s: right argument can not contain NULL values",paVar4);
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffef0,(string *)local_30);
  InvalidInputException::InvalidInputException<std::__cxx11::string>
            (in_stack_ffffffffffffff00,(string *)in_stack_fffffffffffffef8._M_pi,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffef0._M_pi);
  __cxa_throw(uVar2,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
}

Assistant:

static void ListGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	auto count = args.size();

	auto &lhs_vec = args.data[0];
	auto &rhs_vec = args.data[1];

	const auto lhs_count = ListVector::GetListSize(lhs_vec);
	const auto rhs_count = ListVector::GetListSize(rhs_vec);

	auto &lhs_child = ListVector::GetEntry(lhs_vec);
	auto &rhs_child = ListVector::GetEntry(rhs_vec);

	lhs_child.Flatten(lhs_count);
	rhs_child.Flatten(rhs_count);

	D_ASSERT(lhs_child.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rhs_child.GetVectorType() == VectorType::FLAT_VECTOR);

	if (!FlatVector::Validity(lhs_child).CheckAllValid(lhs_count)) {
		throw InvalidInputException("%s: left argument can not contain NULL values", func_name);
	}

	if (!FlatVector::Validity(rhs_child).CheckAllValid(rhs_count)) {
		throw InvalidInputException("%s: right argument can not contain NULL values", func_name);
	}

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);

	BinaryExecutor::ExecuteWithNulls<list_entry_t, list_entry_t, TYPE>(
	    lhs_vec, rhs_vec, result, count,
	    [&](const list_entry_t &left, const list_entry_t &right, ValidityMask &mask, idx_t row_idx) {
		    if (left.length != right.length) {
			    throw InvalidInputException(
			        "%s: list dimensions must be equal, got left length '%d' and right length '%d'", func_name,
			        left.length, right.length);
		    }

		    if (!OP::ALLOW_EMPTY && left.length == 0) {
			    mask.SetInvalid(row_idx);
			    return TYPE();
		    }

		    return OP::Operation(lhs_data + left.offset, rhs_data + right.offset, left.length);
	    });

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}